

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<float> * __thiscall
qclab::dense::SquareMatrix<float>::operator=(SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = matrix->size_;
  if (lVar5 != this->size_) {
    this->size_ = lVar5;
    if (lVar5 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                    ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
    }
    uVar4 = 0xffffffffffffffff;
    if ((ulong)(lVar5 * lVar5) >> 0x3e == 0) {
      uVar4 = lVar5 * lVar5 * 4;
    }
    pfVar2 = (float *)operator_new__(uVar4);
    pfVar1 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar2;
    if (pfVar1 == (float *)0x0) goto LAB_0010d388;
    operator_delete__(pfVar1);
    lVar5 = this->size_;
  }
  if (lVar5 == 0) {
    return this;
  }
LAB_0010d388:
  pfVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  pfVar2 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  lVar3 = 0;
  do {
    pfVar2[lVar3] = pfVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar5 * lVar5 + (ulong)(lVar5 * lVar5 == 0) != lVar3);
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }